

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

gvector gvector_reserve(gvector v,size_t capacity)

{
  ulong *local_30;
  gvector_header *u;
  gvector_header *w;
  size_t capacity_local;
  gvector v_local;
  
  if (v == (gvector)0x0) {
    v_local = (gvector)0x0;
  }
  else {
    local_30 = (ulong *)realloc((void *)((long)v + -0x18),
                                capacity * *(long *)((long)v + -0x10) + 0x18);
    if (local_30 != (ulong *)0x0) {
      *local_30 = capacity;
      if (*local_30 < local_30[2]) {
        local_30[2] = *local_30;
      }
      local_30 = local_30 + 3;
    }
    v_local = local_30;
  }
  return v_local;
}

Assistant:

gvector gvector_reserve(gvector v, size_t capacity)
{
  if (v)
  {
    struct gvector_header *w = ((struct gvector_header*)v) - 1;
    struct gvector_header *u = realloc(w, sizeof(struct gvector_header) + capacity * w->size);
    if (u)
    {
      u->capacity = capacity;
      if (u->length > u->capacity)
      {
        u->length = u->capacity;
      }
      ++u;
    }
    return u;
  }
  return NULL;
}